

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O1

bool __thiscall slang::SourceManager::isCached(SourceManager *this,path *path)

{
  ulong extraout_RAX;
  path absPath;
  error_code ec;
  byte local_79;
  path local_78;
  undefined4 local_50;
  undefined8 local_48;
  path local_40;
  
  std::filesystem::__cxx11::path::path(&local_78);
  if (this->disableProximatePaths == false) {
    local_50 = 0;
    local_48 = std::_V2::system_category();
    std::filesystem::weakly_canonical(&local_40,(error_code *)path);
    isCached();
    if ((extraout_RAX & 1) == 0) {
      local_79 = 0;
      goto LAB_00736bf0;
    }
  }
  else {
    std::filesystem::__cxx11::path::operator=(&local_78,path);
  }
  std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)this);
  isCached();
LAB_00736bf0:
  std::filesystem::__cxx11::path::~path(&local_78);
  return (bool)(local_79 & 1);
}

Assistant:

bool SourceManager::isCached(const fs::path& path) const {
    fs::path absPath;
    if (!disableProximatePaths) {
        std::error_code ec;
        absPath = fs::weakly_canonical(path, ec);
        if (ec)
            return false;
    }
    else {
        absPath = path;
    }

    std::shared_lock<std::shared_mutex> lock(mutex);
    auto it = lookupCache.find(getU8Str(absPath));
    return it != lookupCache.end();
}